

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O3

shared_ptr<vmips::VirtReg> __thiscall
vmips::Function::call<std::shared_ptr<vmips::VirtReg>&>
          (Function *this,weak_ptr<vmips::Function> *target,shared_ptr<vmips::VirtReg> *args)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Atomic_word _Var4;
  element_type *peVar5;
  undefined8 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  bool bVar7;
  shared_ptr<vmips::VirtReg> sVar8;
  initializer_list<std::shared_ptr<vmips::VirtReg>_> __l;
  shared_ptr<vmips::callfunc> calling;
  allocator_type local_62;
  undefined1 local_61;
  callfunc *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  local_50;
  shared_ptr<vmips::VirtReg> local_38;
  Function *local_28;
  
  vmips::VirtReg::create();
  *(undefined1 *)
   &target[0x10].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = 1
  ;
  p_Var2 = (args->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  _Var4 = p_Var2->_M_use_count;
  do {
    LOCK();
    iVar1 = p_Var2->_M_use_count;
    bVar7 = _Var4 == iVar1;
    if (bVar7) {
      p_Var2->_M_use_count = _Var4 + 1;
      iVar1 = _Var4;
    }
    _Var4 = iVar1;
    UNLOCK();
  } while (!bVar7);
  peVar3 = target[0x11].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5 = *(element_type **)
            ((args->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 0x128);
  if (peVar5 < peVar3) {
    peVar5 = peVar3;
  }
  target[0x11].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RCX;
  local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX[1];
  if (local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_38;
  local_28 = (Function *)target;
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  vector(&local_50,__l,&local_62);
  local_60 = (callfunc *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::callfunc,std::allocator<vmips::callfunc>,std::shared_ptr<vmips::VirtReg>&,vmips::Function*,std::weak_ptr<vmips::Function>,std::vector<std::shared_ptr<vmips::VirtReg>,std::allocator<std::shared_ptr<vmips::VirtReg>>>>
            (&local_58,&local_60,(allocator<vmips::callfunc> *)&local_61,
             (shared_ptr<vmips::VirtReg> *)this,&local_28,(weak_ptr<vmips::Function> *)args,
             &local_50);
  std::vector<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>::
  ~vector(&local_50);
  if (local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  p_Var2 = target[0x14].super___weak_ptr<vmips::Function,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  local_50.
  super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_60;
  local_50.
  super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_58._M_pi;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(p_Var2 + 3),(shared_ptr<vmips::Instruction> *)&local_50);
  _Var6._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_50.
      super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_50.
               super__Vector_base<std::shared_ptr<vmips::VirtReg>,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    _Var6._M_pi = extraout_RDX_01;
  }
  sVar8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar8.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> call(std::weak_ptr<Function> target, Args &&... args) {
            auto ret = VirtReg::create();
            has_sub = true;
            sub_argc = std::max(sub_argc, target.lock()->argc);
            auto calling = std::make_shared<callfunc>(ret, this, std::move(target),
                                                      std::vector<std::shared_ptr<VirtReg >>{
                                                              std::forward<Args>(args)...});
            cursor->instructions.push_back(calling);
            return ret;
        }